

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configmng.cpp
# Opt level: O2

void __thiscall banksia::Config::updateOption(Config *this,Option *o)

{
  pointer pOVar1;
  __type _Var2;
  bool bVar3;
  pointer this_00;
  
  this_00 = (this->optionList).super__Vector_base<banksia::Option,_std::allocator<banksia::Option>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pOVar1 = (this->optionList).super__Vector_base<banksia::Option,_std::allocator<banksia::Option>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (this_00 == pOVar1) {
      appendOption(this,o);
      return;
    }
    _Var2 = std::operator==(&this_00->name,&o->name);
    if (_Var2) break;
    this_00 = this_00 + 1;
  }
  bVar3 = Option::operator!=(this_00,o);
  if (bVar3) {
    Option::update(this_00,o);
    return;
  }
  return;
}

Assistant:

void Config::updateOption(const Option& o)
{
    for(auto && option : optionList) {
        if (option.name == o.name) {
            if (option != o) {
                option.update(o);
            }
            return;
        }
    }
    appendOption(o);
}